

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O2

void __thiscall
duckdb::TaskScheduler::SetThreads(TaskScheduler *this,idx_t total_threads,idx_t external_threads)

{
  SyntaxException *pSVar1;
  int iVar2;
  allocator local_39;
  string local_38;
  
  if (total_threads == 0) {
    pSVar1 = (SyntaxException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Number of threads must be positive!",&local_39);
    SyntaxException::SyntaxException(pSVar1,&local_38);
    __cxa_throw(pSVar1,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (external_threads <= total_threads) {
    iVar2 = NumericCastImpl<int,_unsigned_long,_false>::Convert(total_threads - external_threads);
    LOCK();
    (this->requested_thread_count).super___atomic_base<int>._M_i = iVar2;
    UNLOCK();
    return;
  }
  pSVar1 = (SyntaxException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,
             "Number of threads can\'t be smaller than number of external threads!",&local_39);
  SyntaxException::SyntaxException(pSVar1,&local_38);
  __cxa_throw(pSVar1,&SyntaxException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void TaskScheduler::SetThreads(idx_t total_threads, idx_t external_threads) {
	if (total_threads == 0) {
		throw SyntaxException("Number of threads must be positive!");
	}
#ifndef DUCKDB_NO_THREADS
	if (total_threads < external_threads) {
		throw SyntaxException("Number of threads can't be smaller than number of external threads!");
	}
#else
	if (total_threads != external_threads) {
		throw NotImplementedException(
		    "DuckDB was compiled without threads! Setting total_threads != external_threads is not allowed.");
	}
#endif
	requested_thread_count = NumericCast<int32_t>(total_threads - external_threads);
}